

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O2

QImage * __thiscall
QFontEngine::renderedPathForGlyph
          (QImage *__return_storage_ptr__,QFontEngine *this,glyph_t glyph,QColor *color)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined4 extraout_EAX;
  int iVar3;
  long in_FS_OFFSET;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  int height;
  QPainter p;
  QPainterPath path;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  glyph_t glyph_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  glyph_local = glyph;
  (*this->_vptr_QFontEngine[0x1c])(&local_58);
  iVar3 = (int)local_58;
  iVar8 = (int)((ulong)local_58 >> 0x20);
  dVar4 = floor((double)iVar3 * 0.015625);
  dVar5 = floor((double)iVar8 * 0.015625);
  uVar2 = (ulong)puStack_50 >> 0x20;
  dVar6 = ceil((double)((int)puStack_50 + iVar3) * 0.015625);
  dVar7 = ceil((double)((int)uVar2 + iVar8) * 0.015625);
  iVar8 = (int)dVar6 - (int)dVar4;
  height = (int)dVar7 - (int)dVar5;
  auVar1._4_4_ = -(uint)(0 < iVar8);
  auVar1._0_4_ = -(uint)(0 < iVar8);
  auVar1._8_4_ = -(uint)(0 < height);
  auVar1._12_4_ = -(uint)(0 < height);
  iVar3 = movmskpd(extraout_EAX,auVar1);
  if (iVar3 == 3) {
    local_60 = CONCAT44((int)dVar5 * -0x40,(int)dVar4 * -0x40);
    path.d_ptr.d.ptr = (QExplicitlySharedDataPointer<QPainterPathPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath(&path);
    QPainterPath::setFillRule(&path,WindingFill);
    __return_storage_ptr__->d = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->super_QPaintDevice)._vptr_QPaintDevice =
         (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(__return_storage_ptr__->super_QPaintDevice).painters = &DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage(__return_storage_ptr__,iVar8,height,Format_ARGB32_Premultiplied);
    QImage::fill(__return_storage_ptr__,transparent);
    p.d_ptr._M_t.super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
    super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
    super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
         (unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_>)&DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter(&p,&__return_storage_ptr__->super_QPaintDevice);
    QPainter::setRenderHint(&p,Antialiasing,true);
    (*this->_vptr_QFontEngine[0xf])(this,&glyph_local,&local_60,1,&path,0);
    QPainter::setPen(&p,NoPen);
    QPainter::setBrush(&p,*color);
    QPainter::drawPath(&p,&path);
    QPainter::end(&p);
    QPainter::~QPainter(&p);
    QPainterPath::~QPainterPath(&path);
  }
  else {
    QImage::QImage(__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QImage QFontEngine::renderedPathForGlyph(glyph_t glyph, const QColor &color)
{
    glyph_metrics_t gm = boundingBox(glyph);
    int glyph_x = qFloor(gm.x.toReal());
    int glyph_y = qFloor(gm.y.toReal());
    int glyph_width = qCeil((gm.x + gm.width).toReal()) -  glyph_x;
    int glyph_height = qCeil((gm.y + gm.height).toReal()) - glyph_y;

    if (glyph_width <= 0 || glyph_height <= 0)
        return QImage();
    QFixedPoint pt;
    pt.x = -glyph_x;
    pt.y = -glyph_y; // the baseline
    QPainterPath path;
    path.setFillRule(Qt::WindingFill);
    QImage im(glyph_width, glyph_height, QImage::Format_ARGB32_Premultiplied);
    im.fill(Qt::transparent);
    QPainter p(&im);
    p.setRenderHint(QPainter::Antialiasing);
    addGlyphsToPath(&glyph, &pt, 1, &path, { });
    p.setPen(Qt::NoPen);
    p.setBrush(color);
    p.drawPath(path);
    p.end();

    return im;
}